

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O2

int __thiscall ztimer::TimerManager::UnRegisterTimer(TimerManager *this,unsigned_long timerId)

{
  uint uVar1;
  bool bVar2;
  mapped_type *pmVar3;
  iterator iVar4;
  int iVar5;
  unsigned_long timerId_local;
  
  timerId_local = timerId;
  std::mutex::lock(&this->mtx);
  iVar5 = 4;
  if (timerId != 0) {
    bVar2 = TimerExist(this,timerId);
    if (bVar2) {
      pmVar3 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->timerMap,&timerId_local);
      uVar1 = *pmVar3;
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->timerMap)._M_h,&timerId_local);
      iVar4 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->AbsTimerMap)._M_h,&timerId_local);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&(this->AbsTimerMap)._M_h,&timerId_local);
      }
      iVar5 = 0;
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->timeWheel).
                  super__Vector_base<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_h,&timerId_local);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar5;
}

Assistant:

int TimerManager::UnRegisterTimer(unsigned long timerId)
    {
        std::lock_guard<std::mutex> lk(mtx);
        if (!TimerValid(timerId) || !TimerExist(timerId)) {
            return ERR_TIMER_ID_INVALID_NOT_EXIST;
        }
        unsigned int pos = timerMap[timerId];
        timerMap.erase(timerId);
        if (AbsTimerMap.find(timerId) != AbsTimerMap.end()) {
            AbsTimerMap.erase(timerId);
        }
        timeWheel[pos].erase(timerId);
        return ERR_OK;
    }